

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

string * __thiscall Tokens::current_abi_cxx11_(Tokens *this)

{
  pointer pbVar1;
  int iVar2;
  string *psVar3;
  
  pbVar1 = (this->fTokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->fIndex <
      (ulong)((long)(this->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    psVar3 = pbVar1 + this->fIndex;
  }
  else {
    psVar3 = &current[abi:cxx11]()::empty_abi_cxx11_;
    if (current[abi:cxx11]()::empty_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&current[abi:cxx11]()::empty_abi_cxx11_);
      if (iVar2 != 0) {
        psVar3 = &current[abi:cxx11]()::empty_abi_cxx11_;
        current[abi:cxx11]()::empty_abi_cxx11_._M_dataplus._M_p =
             (pointer)&current[abi:cxx11]()::empty_abi_cxx11_.field_2;
        current[abi:cxx11]()::empty_abi_cxx11_._M_string_length = 0;
        current[abi:cxx11]()::empty_abi_cxx11_.field_2._M_local_buf[0] = '\0';
        __cxa_atexit(std::__cxx11::string::~string,&current[abi:cxx11]()::empty_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&current[abi:cxx11]()::empty_abi_cxx11_);
      }
    }
  }
  return psVar3;
}

Assistant:

explicit operator bool() const {
		return fIndex < fTokens.size();
	}